

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compare.cpp
# Opt level: O1

void __thiscall Compare::Compare(Compare *this,string *fileName)

{
  pointer pcVar1;
  string local_38;
  
  pcVar1 = (fileName->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + fileName->_M_string_length);
  GraphGenerator::GraphGenerator(&this->super_GraphGenerator,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_GraphGenerator)._vptr_GraphGenerator = (_func_int **)&PTR_output_00128410;
  memset(&this->timeBase,0,0x90);
  return;
}

Assistant:

Compare::Compare(string fileName): GraphGenerator(fileName) { }